

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<float>_>::MultiplyByScalar
          (TPZMatrix<Fad<float>_> *this,Fad<float> *alpha,TPZMatrix<Fad<float>_> *res)

{
  long *in_RDX;
  undefined8 in_RDI;
  Fad<float> *in_stack_ffffffffffffff20;
  Fad<float> *in_stack_ffffffffffffff28;
  Fad<float> *in_stack_ffffffffffffff30;
  Fad<float> *in_stack_ffffffffffffff48;
  TPZFMatrix<Fad<float>_> *in_stack_ffffffffffffff50;
  
  (**(code **)(*in_RDX + 0xf8))(in_RDX,in_RDI);
  Fad<float>::Fad(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  Storage((TPZMatrix<Fad<float>_> *)in_stack_ffffffffffffff48);
  TPZFMatrix<Fad<float>_>::operator*=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  TPZFMatrixRef<Fad<float>_>::~TPZFMatrixRef((TPZFMatrixRef<Fad<float>_> *)0x131c5b2);
  Fad<float>::~Fad(in_stack_ffffffffffffff20);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultiplyByScalar(const TVar alpha, TPZMatrix<TVar>&res) const
{
  res.CopyFrom(this);
  res.Storage() *= alpha;
}